

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BitMap.cpp
# Opt level: O2

bool axl::sl::BitMap::isEqualImpl(size_t *p1,size_t count1,size_t *p2,size_t count2)

{
  size_t *psVar1;
  int iVar2;
  size_t i;
  bool bVar3;
  
  iVar2 = bcmp(p1,p2,count1 * 8);
  if (iVar2 == 0) {
    do {
      bVar3 = count2 <= count1;
      if (bVar3) {
        return bVar3;
      }
      psVar1 = p2 + count1;
      count1 = count1 + 1;
    } while (*psVar1 == 0);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool
BitMap::isEqualImpl(
	const size_t* p1,
	size_t count1,
	const size_t* p2,
 	size_t count2
) {
	ASSERT(count1 < count2);

	if (memcmp(p1, p2, count1 * sizeof(size_t)))
		return false;

	for (size_t i = count1; i < count2; i++)
		if (p2[i])
			return false;

	return true;
}